

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lzham_vector.h
# Opt level: O0

bool __thiscall
lzham::vector<unsigned_short>::try_resize(vector<unsigned_short> *this,uint new_size,bool grow_hint)

{
  bool bVar1;
  undefined1 in_DL;
  uint in_ESI;
  vector<unsigned_short> *in_RDI;
  undefined3 uVar2;
  uint in_stack_ffffffffffffffdc;
  
  if (in_RDI->m_size != in_ESI) {
    if (in_ESI < in_RDI->m_size) {
      scalar_type<unsigned_short>::destruct_array(in_RDI->m_p + in_ESI,in_RDI->m_size - in_ESI);
    }
    else {
      if (in_RDI->m_capacity < in_ESI) {
        uVar2 = (undefined3)in_stack_ffffffffffffffdc;
        in_stack_ffffffffffffffdc = CONCAT13(1,uVar2);
        if (in_ESI != in_RDI->m_size + 1) {
          in_stack_ffffffffffffffdc = CONCAT13(in_DL,uVar2) & 0x1ffffff;
        }
        bVar1 = increase_capacity(in_RDI,in_stack_ffffffffffffffdc,SUB41(in_ESI >> 0x18,0),
                                  SUB41(in_ESI >> 0x10,0));
        if (!bVar1) {
          return false;
        }
      }
      scalar_type<unsigned_short>::construct_array
                ((unsigned_short *)in_RDI,in_stack_ffffffffffffffdc);
    }
    in_RDI->m_size = in_ESI;
  }
  return true;
}

Assistant:

inline bool try_resize(uint new_size, bool grow_hint = false)
      {
         if (m_size != new_size)
         {
            if (new_size < m_size)
               scalar_type<T>::destruct_array(m_p + new_size, m_size - new_size);
            else
            {
               if (new_size > m_capacity)
               {
                  if (!increase_capacity(new_size, (new_size == (m_size + 1)) || grow_hint, true))
                     return false;
               }

               scalar_type<T>::construct_array(m_p + m_size, new_size - m_size);
            }

            m_size = new_size;
         }

         return true;
      }